

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O3

int __thiscall libnbt::NBTTagVector<long>::remove(NBTTagVector<long> *this,char *__filename)

{
  pointer plVar1;
  pointer plVar2;
  pointer __src;
  char *pcVar3;
  
  plVar1 = (this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar3 = (char *)((long)plVar2 - (long)plVar1 >> 3);
  if (__filename < pcVar3) {
    __src = plVar1 + (long)(__filename + 1);
    if (__src != plVar2) {
      plVar1 = (pointer)memmove(plVar1 + (long)__filename,__src,(long)plVar2 - (long)__src);
      plVar2 = (this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    (this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar2 + -1;
  }
  return (int)CONCAT71((int7)((ulong)plVar1 >> 8),__filename < pcVar3);
}

Assistant:

virtual bool remove(size_t index) {
            if (index < array.size()) {
                array.erase(array.begin() + index);
                return true;
            }
            return false;
        }